

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int arkLsPSetup(void *arkode_mem)

{
  int error_code;
  int *jcur;
  realtype gamma;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  int dgamma_fail;
  realtype gamrat;
  int *local_48;
  realtype local_40;
  ARKLsMem local_38;
  ARKodeMem local_30;
  int local_24;
  realtype local_20;
  
  error_code = arkLs_AccessLMem(arkode_mem,"arkLsPSetup",&local_30,&local_38);
  if (error_code == 0) {
    error_code = (*local_30->step_getgammas)(arkode_mem,&local_40,&local_20,&local_48,&local_24);
    if (error_code == 0) {
      error_code = (*local_38->pset)(local_38->tcur,local_38->ycur,local_38->fcur,
                                     SUB14(local_38->jbad == 0,0),local_48,local_40,local_38->P_data
                                    );
    }
    else {
      arkProcessError(local_30,error_code,"ARKLS","arkLsPSetup",
                      "An error occurred in ark_step_getgammas");
    }
  }
  return error_code;
}

Assistant:

int arkLsPSetup(void *arkode_mem)
{
  ARKodeMem   ark_mem;
  ARKLsMem    arkls_mem;
  realtype    gamma, gamrat;
  booleantype dgamma_fail, *jcur;
  int         retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(arkode_mem, "arkLsPSetup",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* get gamma values from time step module */
  retval = ark_mem->step_getgammas(arkode_mem, &gamma, &gamrat,
                                   &jcur, &dgamma_fail);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKLS", "arkLsPSetup",
                    "An error occurred in ark_step_getgammas");
    return(retval);
  }

  /* Call user pset routine to update preconditioner and possibly
     reset jcur (pass !jbad as update suggestion) */
  retval = arkls_mem->pset(arkls_mem->tcur,
                           arkls_mem->ycur,
                           arkls_mem->fcur,
                           !(arkls_mem->jbad),
                           jcur, gamma,
                           arkls_mem->P_data);
  return(retval);
}